

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void analogies(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  pointer pbVar1;
  long lVar2;
  invalid_argument *this;
  ostream *poVar3;
  int32_t local_164;
  string wordA;
  string prompt;
  string model;
  string wordC;
  string wordB;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  FastText fasttext;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  if (lVar2 == 3) {
    local_164 = 10;
  }
  else {
    if (lVar2 != 4) {
      printAnalogiesUsage();
      exit(1);
    }
    local_164 = std::__cxx11::stoi(pbVar1 + 3,(size_t *)0x0,10);
    if (local_164 < 1) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"k needs to be 1 or higher!");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  ::fasttext::FastText::FastText(&fasttext);
  std::__cxx11::string::string
            ((string *)&model,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading model ");
  poVar3 = std::operator<<(poVar3,(string *)&model);
  std::endl<char,std::char_traits<char>>(poVar3);
  ::fasttext::FastText::loadModel(&fasttext,&model);
  std::__cxx11::string::string((string *)&prompt,"Query triplet (A - B + C)? ",(allocator *)&wordA);
  wordA._M_dataplus._M_p = (pointer)&wordA.field_2;
  wordB._M_dataplus._M_p = (pointer)&wordB.field_2;
  wordC._M_dataplus._M_p = (pointer)&wordC.field_2;
  wordA._M_string_length = 0;
  wordB._M_string_length = 0;
  wordC._M_string_length = 0;
  wordA.field_2._M_local_buf[0] = '\0';
  wordB.field_2._M_local_buf[0] = '\0';
  wordC.field_2._M_local_buf[0] = '\0';
  std::operator<<((ostream *)&std::cout,(string *)&prompt);
  do {
    std::operator>>((istream *)&std::cin,(string *)&wordA);
    std::operator>>((istream *)&std::cin,(string *)&wordB);
    std::operator>>((istream *)&std::cin,(string *)&wordC);
    ::fasttext::FastText::getAnalogies(&local_c0,&fasttext,local_164,&wordA,&wordB,&wordC);
    printPredictions(&local_c0,true,true);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_c0);
    std::operator<<((ostream *)&std::cout,(string *)&prompt);
  } while( true );
}

Assistant:

void analogies(const std::vector<std::string> args) {
  int32_t k;
  if (args.size() == 3) {
    k = 10;
  } else if (args.size() == 4) {
    k = std::stoi(args[3]);
  } else {
    printAnalogiesUsage();
    exit(EXIT_FAILURE);
  }
  if (k <= 0) {
    throw std::invalid_argument("k needs to be 1 or higher!");
  }
  FastText fasttext;
  std::string model(args[2]);
  std::cout << "Loading model " << model << std::endl;
  fasttext.loadModel(model);

  std::string prompt("Query triplet (A - B + C)? ");
  std::string wordA, wordB, wordC;
  std::cout << prompt;
  while (true) {
    std::cin >> wordA;
    std::cin >> wordB;
    std::cin >> wordC;
    printPredictions(fasttext.getAnalogies(k, wordA, wordB, wordC), true, true);

    std::cout << prompt;
  }
  exit(0);
}